

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O1

Span * __thiscall swrenderer::FCoverageBuffer::AllocSpan(FCoverageBuffer *this)

{
  Span *pSVar1;
  
  pSVar1 = this->FreeSpans;
  if (pSVar1 != (Span *)0x0) {
    this->FreeSpans = pSVar1->NextSpan;
    return pSVar1;
  }
  pSVar1 = (Span *)FMemArena::Alloc(&this->SpanArena,0x10);
  return pSVar1;
}

Assistant:

FCoverageBuffer::Span *FCoverageBuffer::AllocSpan()
{
	Span *span;

	if (FreeSpans != NULL)
	{
		span = FreeSpans;
		FreeSpans = span->NextSpan;
	}
	else
	{
		span = (Span *)SpanArena.Alloc(sizeof(Span));
	}
	return span;
}